

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::device_tree::parse_dtb(device_tree *this,string *fn,FILE *param_2)

{
  bool bVar1;
  type input_00;
  undefined1 local_f0 [28];
  uint32_t token;
  input_buffer strings_table;
  input_buffer struct_table;
  unsigned_long local_98;
  uint64_t length;
  uint64_t start;
  input_buffer reservation_map;
  header h;
  input_buffer *input;
  undefined1 local_28 [8];
  unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> in;
  FILE *param_2_local;
  string *fn_local;
  device_tree *this_local;
  
  in._M_t.super___uniq_ptr_impl<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>._M_t.
  super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>.
  super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>)
       (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>)
       param_2;
  input_buffer::buffer_for_file((input_buffer *)local_28,fn,true);
  bVar1 = std::operator==((unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *)
                          local_28,(nullptr_t)0x0);
  if (bVar1) {
    this->valid = false;
  }
  else {
    input_00 = std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>::
               operator*((unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *)
                         local_28);
    dtb::header::header((header *)&reservation_map.cursor);
    bVar1 = dtb::header::read_dtb((header *)&reservation_map.cursor,input_00);
    this->valid = bVar1;
    this->boot_cpu = h.version;
    if (0x11 < h.off_mem_rsvmap) {
      fprintf(_stderr,"Don\'t know how to read this version of the device tree blob");
      this->valid = false;
    }
    if ((this->valid & 1U) != 0) {
      input_buffer::buffer_from_offset((input_buffer *)&start,input_00,h.off_dt_struct,0);
      do {
        bVar1 = input_buffer::consume_binary<unsigned_long>((input_buffer *)&start,&length);
        if ((!bVar1) ||
           (bVar1 = input_buffer::consume_binary<unsigned_long>((input_buffer *)&start,&local_98),
           !bVar1)) {
          fprintf(_stderr,"Failed to read memory reservation table\n");
          this->valid = false;
          goto LAB_00187dd9;
        }
        if ((length != 0) || (local_98 != 0)) {
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                    ((pair<unsigned_long,_unsigned_long> *)&struct_table.size,&length,&local_98);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::push_back(&this->reservations,(value_type *)&struct_table.size);
        }
      } while (length != 0 || local_98 != 0);
      input_buffer::buffer_from_offset
                ((input_buffer *)&strings_table.size,input_00,h.magic,h.boot_cpuid_phys);
      input_buffer::buffer_from_offset
                ((input_buffer *)(local_f0 + 0x18),input_00,h.totalsize,h.last_comp_version);
      bVar1 = input_buffer::consume_binary<unsigned_int>
                        ((input_buffer *)&strings_table.size,(uint *)(local_f0 + 0x14));
      if ((bVar1) && (local_f0._20_4_ == 1)) {
        node::parse_dtb((node *)local_f0,(input_buffer *)&strings_table.size,
                        (input_buffer *)(local_f0 + 0x18));
        std::shared_ptr<dtc::fdt::node>::operator=
                  (&this->root,(shared_ptr<dtc::fdt::node> *)local_f0);
        std::shared_ptr<dtc::fdt::node>::~shared_ptr((shared_ptr<dtc::fdt::node> *)local_f0);
        bVar1 = input_buffer::consume_binary<unsigned_int>
                          ((input_buffer *)&strings_table.size,(uint *)(local_f0 + 0x14));
        if ((bVar1) && (local_f0._20_4_ == 9)) {
          bVar1 = std::operator!=(&this->root,(nullptr_t)0x0);
          this->valid = bVar1;
        }
        else {
          fprintf(_stderr,"Expected FDT_END token after parsing root node.\n");
          this->valid = false;
        }
      }
      else {
        fprintf(_stderr,"Expected FDT_BEGIN_NODE token.\n");
        this->valid = false;
      }
      input_buffer::~input_buffer((input_buffer *)(local_f0 + 0x18));
      input_buffer::~input_buffer((input_buffer *)&strings_table.size);
LAB_00187dd9:
      input_buffer::~input_buffer((input_buffer *)&start);
    }
  }
  std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>::~unique_ptr
            ((unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *)local_28);
  return;
}

Assistant:

void
device_tree::parse_dtb(const string &fn, FILE *)
{
	auto in = input_buffer::buffer_for_file(fn);
	if (in == 0)
	{
		valid = false;
		return;
	}
	input_buffer &input = *in;
	dtb::header h;
	valid = h.read_dtb(input);
	boot_cpu = h.boot_cpuid_phys;
	if (h.last_comp_version > 17)
	{
		fprintf(stderr, "Don't know how to read this version of the device tree blob");
		valid = false;
	}
	if (!valid)
	{
		return;
	}
	input_buffer reservation_map =
		input.buffer_from_offset(h.off_mem_rsvmap, 0);
	uint64_t start, length;
	do
	{
		if (!(reservation_map.consume_binary(start) &&
		      reservation_map.consume_binary(length)))
		{
			fprintf(stderr, "Failed to read memory reservation table\n");
			valid = false;
			return;
		}
		if (start != 0 || length != 0)
		{
			reservations.push_back(reservation(start, length));
		}
	} while (!((start == 0) && (length == 0)));
	input_buffer struct_table =
		input.buffer_from_offset(h.off_dt_struct, h.size_dt_struct);
	input_buffer strings_table =
		input.buffer_from_offset(h.off_dt_strings, h.size_dt_strings);
	uint32_t token;
	if (!(struct_table.consume_binary(token) &&
		(token == dtb::FDT_BEGIN_NODE)))
	{
		fprintf(stderr, "Expected FDT_BEGIN_NODE token.\n");
		valid = false;
		return;
	}
	root = node::parse_dtb(struct_table, strings_table);
	if (!(struct_table.consume_binary(token) && (token == dtb::FDT_END)))
	{
		fprintf(stderr, "Expected FDT_END token after parsing root node.\n");
		valid = false;
		return;
	}
	valid = (root != 0);
}